

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O3

LogLevel __thiscall cmMakefile::GetCurrentLogLevel(cmMakefile *this)

{
  cmake *pcVar1;
  LogLevel LVar2;
  string *psVar3;
  char *extraout_RDX;
  LogLevel LVar4;
  string_view levelStr;
  string local_48;
  
  pcVar1 = this->GlobalGenerator->CMakeInstance;
  LVar4 = pcVar1->MessageLogLevel;
  if (LVar4 != LOG_UNDEFINED) {
    if (pcVar1->LogLevelWasSetViaCLI == false) {
      local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_48,"CMAKE_MESSAGE_LOG_LEVEL","");
      psVar3 = (string *)GetDefinition(this,&local_48);
      if (psVar3 == (string *)0x0) {
        psVar3 = &cmValue::Empty_abi_cxx11_;
      }
      levelStr._M_str = extraout_RDX;
      levelStr._M_len = (size_t)(psVar3->_M_dataplus)._M_p;
      LVar2 = cmake::StringToLogLevel((cmake *)psVar3->_M_string_length,levelStr);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_48._M_dataplus._M_p != &local_48.field_2) {
        operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
      }
      if (LVar2 != LOG_UNDEFINED) {
        LVar4 = LVar2;
      }
    }
    return LVar4;
  }
  __assert_fail("\"Expected a valid log level here\" && logLevelCliOrDefault != Message::LogLevel::LOG_UNDEFINED"
                ,
                "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmMakefile.cxx"
                ,0x9e,"Message::LogLevel cmMakefile::GetCurrentLogLevel() const");
}

Assistant:

cmake* cmMakefile::GetCMakeInstance() const
{
  return this->GlobalGenerator->GetCMakeInstance();
}